

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::applyLifeCircle(Map *this,shared_ptr<Population> *population)

{
  int32_t iVar1;
  int iVar2;
  TypeName TVar3;
  ParamType PVar4;
  int32_t iVar5;
  ParamType PVar6;
  ParamType PVar7;
  ParamType PVar8;
  element_type *peVar9;
  reference pvVar10;
  __shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var11;
  element_type *peVar12;
  size_t sVar13;
  Config *pCVar14;
  element_type *peVar15;
  int *piVar16;
  int32_t local_40;
  int32_t k;
  int local_38;
  int local_34;
  int32_t wasEaten;
  int32_t nutrition;
  int32_t carnivoreAmount;
  int32_t herbivoreAmount;
  int32_t water;
  int32_t food;
  int32_t yPos;
  int32_t xPos;
  shared_ptr<Population> *population_local;
  Map *this_local;
  
  _yPos = population;
  population_local = (shared_ptr<Population> *)this;
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  food = Population::GetXPos(peVar9);
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  water = Population::GetYPos(peVar9);
  pvVar10 = std::
            vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
            ::operator[](&this->map,(long)water);
  p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
            operator[](pvVar10,(long)food);
  peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      (p_Var11);
  herbivoreAmount = CellType::getPlantsCount(peVar12);
  pvVar10 = std::
            vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
            ::operator[](&this->map,(long)water);
  p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
            operator[](pvVar10,(long)food);
  peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      (p_Var11);
  carnivoreAmount = CellType::getWaterLevel(peVar12);
  nutrition = 0;
  wasEaten = 0;
  if (water % 2 == 1) {
    if (-1 < water + -1) {
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)(water + -1));
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)food);
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getHerbivoreCount(peVar12);
      nutrition = iVar1 + nutrition;
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)(water + -1));
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)food);
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getCarnivoreCount(peVar12);
      wasEaten = iVar1 + wasEaten;
    }
    iVar2 = water + 1;
    sVar13 = getHeight(this);
    if ((ulong)(long)iVar2 < sVar13) {
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)(water + 1));
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)food);
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getHerbivoreCount(peVar12);
      nutrition = iVar1 + nutrition;
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)(water + 1));
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)food);
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getCarnivoreCount(peVar12);
      wasEaten = iVar1 + wasEaten;
    }
    if (-1 < food + -1) {
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)water);
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)(food + -1));
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getHerbivoreCount(peVar12);
      nutrition = iVar1 + nutrition;
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)water);
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)(food + -1));
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getCarnivoreCount(peVar12);
      wasEaten = iVar1 + wasEaten;
    }
    iVar2 = food + 1;
    sVar13 = getWidth(this);
    if ((ulong)(long)iVar2 < sVar13) {
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)water);
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)(food + 1));
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getHerbivoreCount(peVar12);
      nutrition = iVar1 + nutrition;
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)water);
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)(food + 1));
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getCarnivoreCount(peVar12);
      wasEaten = iVar1 + wasEaten;
      if (-1 < water + -1) {
        pvVar10 = std::
                  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                  ::operator[](&this->map,(long)(water + -1));
        p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar10,(long)(food + 1));
        peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var11);
        iVar1 = CellType::getHerbivoreCount(peVar12);
        nutrition = iVar1 + nutrition;
        pvVar10 = std::
                  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                  ::operator[](&this->map,(long)(water + -1));
        p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar10,(long)(food + 1));
        peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var11);
        iVar1 = CellType::getCarnivoreCount(peVar12);
        wasEaten = iVar1 + wasEaten;
      }
      iVar2 = water + 1;
      sVar13 = getHeight(this);
      if ((ulong)(long)iVar2 < sVar13) {
        pvVar10 = std::
                  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                  ::operator[](&this->map,(long)(water + 1));
        p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar10,(long)(food + 1));
        peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var11);
        iVar1 = CellType::getHerbivoreCount(peVar12);
        nutrition = iVar1 + nutrition;
        pvVar10 = std::
                  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                  ::operator[](&this->map,(long)(water + 1));
        p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar10,(long)(food + 1));
        peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var11);
        iVar1 = CellType::getCarnivoreCount(peVar12);
        wasEaten = iVar1 + wasEaten;
      }
    }
  }
  else {
    if (-1 < water + -1) {
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)(water + -1));
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)food);
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getHerbivoreCount(peVar12);
      nutrition = iVar1 + nutrition;
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)(water + -1));
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)food);
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getCarnivoreCount(peVar12);
      wasEaten = iVar1 + wasEaten;
    }
    iVar2 = water + 1;
    sVar13 = getHeight(this);
    if ((ulong)(long)iVar2 < sVar13) {
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)(water + 1));
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)food);
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getHerbivoreCount(peVar12);
      nutrition = iVar1 + nutrition;
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)(water + 1));
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)food);
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getCarnivoreCount(peVar12);
      wasEaten = iVar1 + wasEaten;
    }
    iVar2 = food + 1;
    sVar13 = getWidth(this);
    if ((ulong)(long)iVar2 < sVar13) {
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)water);
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)(food + 1));
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getHerbivoreCount(peVar12);
      nutrition = iVar1 + nutrition;
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)water);
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)(food + 1));
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getCarnivoreCount(peVar12);
      wasEaten = iVar1 + wasEaten;
    }
    if (-1 < food + -1) {
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)water);
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)(food + -1));
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getHerbivoreCount(peVar12);
      nutrition = iVar1 + nutrition;
      pvVar10 = std::
                vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ::operator[](&this->map,(long)water);
      p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar10,(long)(food + -1));
      peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      iVar1 = CellType::getCarnivoreCount(peVar12);
      wasEaten = iVar1 + wasEaten;
      if (-1 < water + -1) {
        pvVar10 = std::
                  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                  ::operator[](&this->map,(long)(water + -1));
        p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar10,(long)(food + -1));
        peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var11);
        iVar1 = CellType::getHerbivoreCount(peVar12);
        nutrition = iVar1 + nutrition;
        pvVar10 = std::
                  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                  ::operator[](&this->map,(long)(water + -1));
        p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar10,(long)(food + -1));
        peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var11);
        iVar1 = CellType::getCarnivoreCount(peVar12);
        wasEaten = iVar1 + wasEaten;
      }
      iVar2 = water + 1;
      sVar13 = getHeight(this);
      if ((ulong)(long)iVar2 < sVar13) {
        pvVar10 = std::
                  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                  ::operator[](&this->map,(long)(water + 1));
        p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar10,(long)(food + -1));
        peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var11);
        iVar1 = CellType::getHerbivoreCount(peVar12);
        nutrition = iVar1 + nutrition;
        pvVar10 = std::
                  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                  ::operator[](&this->map,(long)(water + 1));
        p_Var11 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar10,(long)(food + -1));
        peVar12 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var11);
        iVar1 = CellType::getCarnivoreCount(peVar12);
        wasEaten = iVar1 + wasEaten;
      }
    }
  }
  nutrition = nutrition / 3;
  wasEaten = wasEaten / 3;
  local_34 = (herbivoreAmount + carnivoreAmount) / 2;
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  TVar3 = Population::GetType(peVar9);
  if (TVar3 == CARNIVORE) {
    iVar2 = nutrition * 100;
    pCVar14 = Config::getInstance();
    iVar1 = Config::getMaxAmount(pCVar14,HERBIVORE,AVERAGE);
    local_34 = (iVar2 / iVar1 + carnivoreAmount) / 2;
  }
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  peVar15 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       population);
  iVar1 = Population::GetAnimalAmount(peVar15);
  Population::SetAnimalAmount(peVar9,(iVar1 * local_34) / 100);
  iVar2 = wasEaten * 100;
  pCVar14 = Config::getInstance();
  iVar1 = Config::getMaxAmount(pCVar14,CARNIVORE,AVERAGE);
  local_38 = iVar2 / iVar1;
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  PVar4 = Population::GetVelocity(peVar9);
  switch(PVar4) {
  case VERY_SMALL:
    local_38 = local_38 / 2;
    break;
  case SMALL:
    local_38 = (local_38 << 1) / 5;
    break;
  case AVERAGE:
    local_38 = (local_38 * 3) / 10;
    break;
  case BIG:
    local_38 = local_38 / 5;
    break;
  case VERY_BIG:
    local_38 = local_38 / 10;
  }
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  peVar15 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       population);
  iVar1 = Population::GetAnimalAmount(peVar15);
  Population::SetAnimalAmount(peVar9,(iVar1 * (100 - local_38)) / 100);
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  peVar15 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       population);
  iVar1 = Population::GetAnimalAmount(peVar15);
  peVar15 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       population);
  iVar5 = Population::GetProductivity(peVar15);
  k = (iVar1 * (iVar5 + 200)) / 100;
  pCVar14 = Config::getInstance();
  peVar15 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       population);
  TVar3 = Population::GetType(peVar15);
  peVar15 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       population);
  PVar4 = Population::GetSize(peVar15);
  local_40 = Config::getMaxAmount(pCVar14,TVar3,PVar4);
  piVar16 = std::min<int>(&k,&local_40);
  Population::SetAnimalAmount(peVar9,*piVar16);
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  iVar1 = Population::GetProductivity(peVar9);
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  PVar4 = Population::GetSize(peVar9);
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  PVar6 = Population::GetCover(peVar9);
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  iVar5 = Population::GetHealth(peVar9);
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  PVar7 = Population::GetVelocity(peVar9);
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  PVar8 = Population::GetSafety(peVar9);
  peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  Population::SetBiologyDev(peVar9,(int)(iVar1 * (PVar4 + PVar6) + iVar5 * (PVar7 + PVar8)) / 0x14);
  return;
}

Assistant:

void Map::applyLifeCircle(std::shared_ptr<Population> population) {
  int32_t xPos = population->GetXPos();
  int32_t yPos = population->GetYPos();
  int32_t food = map[yPos][xPos]->getPlantsCount();
  int32_t water = map[yPos][xPos]->getWaterLevel();
  int32_t herbivoreAmount = 0;
  int32_t carnivoreAmount = 0;

  if (yPos % 2 == 1) {
    if (yPos - 1 >= 0) {
      herbivoreAmount += map[yPos - 1][xPos]->getHerbivoreCount();
      carnivoreAmount += map[yPos - 1][xPos]->getCarnivoreCount();
    }
    if (yPos + 1 < getHeight()) {
      herbivoreAmount += map[yPos + 1][xPos]->getHerbivoreCount();
      carnivoreAmount += map[yPos + 1][xPos]->getCarnivoreCount();
    }
    if (xPos - 1 >= 0) {
      herbivoreAmount += map[yPos][xPos - 1]->getHerbivoreCount();
      carnivoreAmount += map[yPos][xPos - 1]->getCarnivoreCount();
    }
    if (xPos + 1 < getWidth()) {
      herbivoreAmount += map[yPos][xPos + 1]->getHerbivoreCount();
      carnivoreAmount += map[yPos][xPos + 1]->getCarnivoreCount();
      if (yPos - 1 >= 0) {
        herbivoreAmount += map[yPos - 1][xPos + 1]->getHerbivoreCount();
        carnivoreAmount += map[yPos - 1][xPos + 1]->getCarnivoreCount();
      }
      if (yPos + 1 < getHeight()) {
        herbivoreAmount += map[yPos + 1][xPos + 1]->getHerbivoreCount();
        carnivoreAmount += map[yPos + 1][xPos + 1]->getCarnivoreCount();
      }
    }
  } else {
    if (yPos - 1 >= 0) {
      herbivoreAmount += map[yPos - 1][xPos]->getHerbivoreCount();
      carnivoreAmount += map[yPos - 1][xPos]->getCarnivoreCount();
    }
    if (yPos + 1 < getHeight()) {
      herbivoreAmount += map[yPos + 1][xPos]->getHerbivoreCount();
      carnivoreAmount += map[yPos + 1][xPos]->getCarnivoreCount();
    }
    if (xPos + 1 < getWidth()) {
      herbivoreAmount += map[yPos][xPos + 1]->getHerbivoreCount();
      carnivoreAmount += map[yPos][xPos + 1]->getCarnivoreCount();
    }
    if (xPos - 1 >= 0) {
      herbivoreAmount += map[yPos][xPos - 1]->getHerbivoreCount();
      carnivoreAmount += map[yPos][xPos - 1]->getCarnivoreCount();
      if (yPos - 1 >= 0) {
        herbivoreAmount += map[yPos - 1][xPos - 1]->getHerbivoreCount();
        carnivoreAmount += map[yPos - 1][xPos - 1]->getCarnivoreCount();
      }
      if (yPos + 1 < getHeight()) {
        herbivoreAmount += map[yPos + 1][xPos - 1]->getHerbivoreCount();
        carnivoreAmount += map[yPos + 1][xPos - 1]->getCarnivoreCount();
      }
    }
  }

  herbivoreAmount /= 3;
  carnivoreAmount /= 3;
  //if there's no food or water someone must die
  int32_t nutrition = (food + water) / 2;
  if (population->GetType() == Population::TypeName::CARNIVORE) {
    nutrition =
        (herbivoreAmount * 100 / Config::getInstance().getMaxAmount(Population::HERBIVORE, Population::AVERAGE) + water)
            / 2;
  }
  population->SetAnimalAmount((population->GetAnimalAmount() * nutrition) / 100);
  // carnivore animal can eat some animals from the population
  int32_t
      wasEaten = carnivoreAmount * 100 / Config::getInstance().getMaxAmount(Population::CARNIVORE, Population::AVERAGE);
  switch (population->GetVelocity()) {
    case Population::VERY_SMALL:wasEaten = wasEaten / 2;
      break;
    case Population::SMALL:wasEaten = wasEaten * 2 / 5;
      break;
    case Population::AVERAGE:wasEaten = wasEaten * 3 / 10;
      break;
    case Population::BIG:wasEaten = wasEaten / 5;
      break;
    case Population::VERY_BIG:wasEaten = wasEaten / 10;
      break;
  }
  population->SetAnimalAmount((population->GetAnimalAmount() * (100 - wasEaten)) / 100);
  // but new animals are born
  population->SetAnimalAmount(std::min(population->GetAnimalAmount() * (population->GetProductivity() + 200) / 100,
                                       Config::getInstance().getMaxAmount(population->GetType(),
                                                                          population->GetSize())));

  //some game points
  int32_t k = (population->GetProductivity()
      * (static_cast<int32_t>(population->GetSize()) + static_cast<int32_t>(population->GetCover()))
      + population->GetHealth()
          * (static_cast<int32_t>(population->GetVelocity()) + static_cast<int32_t>(population->GetSafety()))) / 20;
  population->SetBiologyDev(k);
}